

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall
doctest::detail::ContextScopeBase::ContextScopeBase(ContextScopeBase *this,ContextScopeBase *other)

{
  long *in_FS_OFFSET;
  ContextScopeBase *local_18;
  
  (this->super_IContextScope)._vptr_IContextScope = (_func_int **)&PTR__IContextScope_00147320;
  this->need_to_destroy = true;
  if (other->need_to_destroy == true) {
    destroy(other);
  }
  other->need_to_destroy = false;
  g_infoContexts::__tls_init();
  local_18 = this;
  std::vector<doctest::IContextScope*,std::allocator<doctest::IContextScope*>>::
  emplace_back<doctest::IContextScope*>
            ((vector<doctest::IContextScope*,std::allocator<doctest::IContextScope*>> *)
             (*in_FS_OFFSET + -0x30),(IContextScope **)&local_18);
  return;
}

Assistant:

ContextScopeBase::ContextScopeBase(ContextScopeBase&& other) {
        if (other.need_to_destroy) {
            other.destroy();
        }
        other.need_to_destroy = false;
        g_infoContexts.push_back(this);
    }